

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O2

Lit __thiscall Minisat::Solver::pickBranchLit(Solver *this)

{
  double *pdVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  undefined8 in_RAX;
  uint *puVar5;
  Heap<Minisat::Solver::VarOrderLt> *this_00;
  double dVar6;
  undefined8 uStack_38;
  
  iVar4 = -1;
  uStack_38 = in_RAX;
  do {
    if (iVar4 != -1) {
      uStack_38 = CONCAT17((this->assigns).data[iVar4].value,(undefined7)uStack_38);
      bVar2 = lbool::operator!=((lbool *)((long)&uStack_38 + 7),(lbool)0x2);
      if ((!bVar2) && ((this->decision).data[iVar4] != '\0')) {
        if ((this->posMissingInSome == 0) || (this->negMissingInSome == 0)) {
          bVar2 = this->posMissingInSome == 0;
        }
        else {
          bVar2 = (this->polarity).data[iVar4] == '\0';
        }
        return (Lit)((uint)!bVar2 + iVar4 * 2);
      }
    }
    this_00 = this->order_heap;
    if ((this_00->heap).sz == 0) {
      return (Lit)-2;
    }
    if (this->current_heuristic == CHB) {
      iVar4 = *(this_00->heap).data;
      uVar3 = (uint)this->conflicts;
      puVar5 = (this->canceled).data;
      while (uVar3 - puVar5[iVar4] != 0) {
        dVar6 = pow(0.95,(double)(uVar3 - puVar5[iVar4]));
        pdVar1 = (this->activity_CHB).data;
        pdVar1[iVar4] = dVar6 * pdVar1[iVar4];
        this_00 = this->order_heap;
        if ((iVar4 < (this_00->indices).sz) && (-1 < (this_00->indices).data[iVar4])) {
          Heap<Minisat::Solver::VarOrderLt>::increase(this_00,iVar4);
          this_00 = this->order_heap;
        }
        uVar3 = (uint)this->conflicts;
        puVar5 = (this->canceled).data;
        puVar5[iVar4] = uVar3;
        iVar4 = *(this_00->heap).data;
      }
    }
    iVar4 = Heap<Minisat::Solver::VarOrderLt>::removeMin(this_00);
  } while( true );
}

Assistant:

Lit Solver::pickBranchLit()
{
    Var next = var_Undef;

    // Random decision:
    /*if (drand(random_seed) < random_var_freq && !order_heap.empty()){
        next = order_heap[irand(random_seed,order_heap.size())];
        if (value(next) == l_Undef && decision[next])
            rnd_decisions++; }*/

    // Activity based decision:
    while (next == var_Undef || value(next) != l_Undef || !decision[next])
        if (order_heap->empty())
            return lit_Undef;
        else {
#ifdef ANTI_EXPLORATION
            if (usesCHB()) {
                Var v = (*order_heap)[0];
                uint32_t age = conflicts - canceled[v];
                while (age > 0) {
                    double decay = pow(0.95, age);
                    activity_CHB[v] *= decay;
                    if (order_heap->inHeap(v)) order_heap->increase(v);
                    canceled[v] = conflicts;
                    v = (*order_heap)[0];
                    age = conflicts - canceled[v];
                }
            }
#endif
            next = order_heap->removeMin();
        }

    // in case we found (almost) pure literals, disable phase-saving
    if (posMissingInSome == 0 || negMissingInSome == 0)
        return posMissingInSome == 0 ? mkLit(next, false) : mkLit(next, true);

    return mkLit(next, polarity[next]);
}